

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  byte *pbVar5;
  
  lVar2 = -(long)ptr;
  do {
    pcVar3 = end + lVar2;
    if ((long)pcVar3 < 2) {
      return -1;
    }
    bVar1 = *ptr;
    if (0xdb < bVar1) {
      if (bVar1 == 0xff) {
        if (0xfd < ((byte *)ptr)[1]) {
switchD_0058613a_caseD_0:
          *nextTokPtr = ptr;
          return 0;
        }
      }
      else if (bVar1 - 0xdc < 4) goto switchD_0058613a_caseD_0;
      goto switchD_0058613a_caseD_2;
    }
    if (bVar1 - 0xd8 < 4) {
switchD_0058613a_caseD_7:
      if (pcVar3 < (char *)0x4) {
        return -2;
      }
      pbVar5 = (byte *)ptr + 4;
      goto LAB_0058615b;
    }
    if (bVar1 == 0) {
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
      switch(bVar1) {
      case 0:
      case 1:
      case 8:
        goto switchD_0058613a_caseD_0;
      default:
        goto switchD_0058613a_caseD_2;
      case 6:
        if (pcVar3 == (char *)0x2) {
          return -2;
        }
        pbVar5 = (byte *)ptr + 3;
        break;
      case 7:
        goto switchD_0058613a_caseD_7;
      case 0xc:
      case 0xd:
        pbVar5 = (byte *)ptr + 2;
        if ((uint)bVar1 == open) {
          if ((long)end - (long)pbVar5 < 2) {
            return -0x1b;
          }
          *nextTokPtr = (char *)pbVar5;
          if (*pbVar5 != 0) {
            return 0;
          }
          uVar4 = (uint)*(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]);
          if (0x1e < uVar4) {
            return 0;
          }
          if ((0x40300e00U >> (uVar4 & 0x1f) & 1) == 0) {
            return 0;
          }
          return 0x1b;
        }
      }
    }
    else {
switchD_0058613a_caseD_2:
      pbVar5 = (byte *)ptr + 2;
    }
LAB_0058615b:
    lVar2 = -(long)pbVar5;
    ptr = (char *)pbVar5;
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
      INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
      case BT_GT:
      case BT_PERCNT:
      case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}